

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void TrimInitialSpace(TidyDocImpl *doc,Node *element,Node *text)

{
  uint uVar1;
  Lexer *lexer;
  tmbstr ptVar2;
  Bool BVar3;
  Node *pNVar4;
  
  lexer = doc->lexer;
  BVar3 = prvTidynodeIsText(text);
  if (((BVar3 != no) && (lexer->lexbuf[text->start] == ' ')) && (text->start < text->end)) {
    if ((element->tag->model & 0x410) == 0x10) {
      pNVar4 = element->prev;
      BVar3 = prvTidynodeIsText(pNVar4);
      if (BVar3 == no) {
        pNVar4 = prvTidyNewNode(lexer->allocator,lexer);
        uVar1 = element->start;
        element->start = uVar1 + 1;
        pNVar4->start = uVar1;
        pNVar4->end = element->start;
        lexer->lexbuf[uVar1] = ' ';
        prvTidyInsertNodeBeforeElement(element,pNVar4);
      }
      else {
        uVar1 = pNVar4->end;
        ptVar2 = lexer->lexbuf;
        if (((ulong)uVar1 == 0) || (ptVar2[uVar1 - 1] != ' ')) {
          pNVar4->end = uVar1 + 1;
          ptVar2[uVar1] = ' ';
        }
        element->start = element->start + 1;
      }
    }
    text->start = text->start + 1;
  }
  return;
}

Assistant:

static void TrimInitialSpace( TidyDocImpl* doc, Node *element, Node *text )
{
    Lexer* lexer = doc->lexer;
    Node *prev, *node;

    if ( TY_(nodeIsText)(text) &&
         lexer->lexbuf[text->start] == ' ' &&
         text->start < text->end )
    {
        if ( (element->tag->model & CM_INLINE) &&
             !(element->tag->model & CM_FIELD) )
        {
            prev = element->prev;

            if (TY_(nodeIsText)(prev))
            {
                if (prev->end == 0 || lexer->lexbuf[prev->end - 1] != ' ')
                    lexer->lexbuf[(prev->end)++] = ' ';

                ++(element->start);
            }
            else /* create new node */
            {
                node = TY_(NewNode)(lexer->allocator, lexer);
                node->start = (element->start)++;
                node->end = element->start;
                lexer->lexbuf[node->start] = ' ';
                TY_(InsertNodeBeforeElement)(element ,node);
                DEBUG_LOG(SPRTF("TrimInitialSpace: Created text node, inserted before <%s>\n",
                    (element->element ? element->element : "unknown")));
            }
        }

        /* discard the space in current node */
        ++(text->start);
    }
}